

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<ProKey,_ProString>_>::freeData
          (Span<QHashPrivate::Node<ProKey,_ProString>_> *this)

{
  byte bVar1;
  void *pvVar2;
  Node<ProKey,_ProString> *pNVar3;
  Node<ProKey,_ProString> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  Node<ProKey,_ProString> *local_18;
  
  if (*(long *)&in_RDI[1].key.super_ProString.m_file != 0) {
    pNVar3 = in_RDI + 1;
    for (local_18 = in_RDI;
        local_18 != (Node<ProKey,_ProString> *)&(pNVar3->key).super_ProString.m_file;
        local_18 = (Node<ProKey,_ProString> *)
                   ((long)&(local_18->key).super_ProString.m_string.d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).super_ProString.m_string.d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(*(long *)&in_RDI[1].key.super_ProString.m_file + (ulong)bVar1 * 0x60))
        ;
        Node<ProKey,_ProString>::~Node(in_RDI);
      }
    }
    pvVar2 = *(void **)&in_RDI[1].key.super_ProString.m_file;
    if (pvVar2 != (void *)0x0) {
      operator_delete__(pvVar2);
    }
    *(undefined8 *)&in_RDI[1].key.super_ProString.m_file = 0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }